

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

char * arg_strptime(char *buf,char *fmt,tm *tm)

{
  byte *pbVar1;
  byte bVar2;
  ushort *puVar3;
  __int32_t *p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined1 auVar9 [4];
  ushort **ppuVar10;
  size_t n;
  __int32_t **pp_Var11;
  long lVar12;
  char *pcVar13;
  tm *ptVar14;
  byte bVar15;
  byte *pbVar16;
  long lVar17;
  undefined1 local_74 [4];
  byte *local_70;
  tm *local_68;
  int local_5c;
  ushort **local_58;
  tm *local_50;
  tm *local_48;
  tm *local_40;
  int *local_38;
  
  bVar15 = *fmt;
  if (bVar15 == 0) {
switchD_00105f08_caseD_26:
    return buf;
  }
  local_70 = (byte *)buf;
  local_68 = tm;
  ppuVar10 = __ctype_b_loc();
  local_48 = (tm *)&local_68->tm_wday;
  local_50 = (tm *)&local_68->tm_hour;
  local_40 = (tm *)&local_68->tm_min;
  local_38 = &local_68->tm_mday;
  local_5c = 0;
LAB_00105e97:
  ptVar14 = local_50;
  puVar3 = *ppuVar10;
  pbVar16 = (byte *)fmt + 2;
  while (pbVar1 = local_70, (*(byte *)((long)puVar3 + (long)(char)bVar15 * 2 + 1) & 0x20) != 0) {
    local_70 = local_70 + -1;
    do {
      pbVar1 = local_70 + 1;
      local_70 = local_70 + 1;
    } while ((*(byte *)((long)puVar3 + (long)(char)*pbVar1 * 2 + 1) & 0x20) != 0);
    bVar15 = ((byte *)fmt)[1];
    fmt = (char *)((byte *)fmt + 1);
    pbVar16 = pbVar16 + 1;
    if (bVar15 == 0) {
      return (char *)local_70;
    }
  }
  if (bVar15 == 0x25) {
    bVar6 = true;
    bVar7 = true;
    bVar5 = true;
LAB_00105eec:
    bVar15 = pbVar16[-1];
    buf = (char *)0x0;
    switch(bVar15) {
    case 0x25:
      goto switchD_00105f08_caseD_25;
    default:
      goto switchD_00105f08_caseD_26;
    case 0x41:
    case 0x61:
      if (!bVar6) {
        return (char *)0x0;
      }
      lVar12 = 0;
      lVar17 = 0;
      local_58 = ppuVar10;
      goto LAB_0010606c;
    case 0x42:
    case 0x62:
    case 0x68:
      if (!bVar6) {
        return (char *)0x0;
      }
      lVar12 = 0;
      lVar17 = 0;
      local_58 = ppuVar10;
      goto LAB_00105f6d;
    case 0x43:
      if (!bVar7) {
        return (char *)0x0;
      }
      iVar8 = conv_num((char **)&local_70,(int *)local_74,0,99);
      if (iVar8 == 0) {
        return (char *)0x0;
      }
      if (local_5c == 0) {
        local_68->tm_year = (int)local_74 * 100;
      }
      else {
        local_68->tm_year = (int)local_74 * 100 + local_68->tm_year % 100;
      }
      goto LAB_00106532;
    case 0x44:
      if (!bVar6) {
        return (char *)0x0;
      }
      goto LAB_0010642d;
    case 0x45:
      bVar5 = false;
      if (!bVar6) {
        return (char *)0x0;
      }
      bVar7 = true;
      goto LAB_00105f28;
    case 0x48:
      if (!bVar5) {
        return (char *)0x0;
      }
      goto LAB_0010643f;
    case 0x49:
      if (!bVar5) {
        return (char *)0x0;
      }
      goto LAB_0010620a;
    case 0x4d:
      if (!bVar5) {
        return (char *)0x0;
      }
      iVar8 = 0x3b;
      ptVar14 = local_40;
      goto LAB_00106453;
    case 0x4f:
      bVar7 = false;
      if (!bVar6) {
        return (char *)0x0;
      }
      bVar5 = true;
LAB_00105f28:
      pbVar16 = pbVar16 + 1;
      bVar6 = false;
      goto LAB_00105eec;
    case 0x52:
      if (!bVar6) {
        return (char *)0x0;
      }
      pcVar13 = "%H:%M";
      break;
    case 0x53:
      if (!bVar5) {
        return (char *)0x0;
      }
      iVar8 = 0x3d;
      ptVar14 = local_68;
      goto LAB_00106453;
    case 0x54:
      if (!bVar6) {
        return (char *)0x0;
      }
      goto LAB_0010648d;
    case 0x55:
    case 0x57:
      if (!bVar5) {
        return (char *)0x0;
      }
      ptVar14 = (tm *)local_74;
      iVar8 = 0x35;
      goto LAB_00106453;
    case 0x58:
      if (!bVar7) {
        return (char *)0x0;
      }
LAB_0010648d:
      pcVar13 = "%H:%M:%S";
      break;
    case 0x59:
      if (!bVar7) {
        return (char *)0x0;
      }
      iVar8 = conv_num((char **)&local_70,(int *)local_74,0,9999);
      if (iVar8 == 0) {
        return (char *)0x0;
      }
      local_68->tm_year = (int)local_74 + -0x76c;
      goto LAB_00105f48;
    case 99:
      if (!bVar7) {
        return (char *)0x0;
      }
      pcVar13 = "%x %X";
      break;
    case 100:
    case 0x65:
      if (!bVar5) {
        return (char *)0x0;
      }
      iVar8 = conv_num((char **)&local_70,local_38,1,0x1f);
      if (iVar8 == 0) {
        return (char *)0x0;
      }
      goto LAB_00105f48;
    case 0x6a:
      if (!bVar6) {
        return (char *)0x0;
      }
      iVar8 = conv_num((char **)&local_70,(int *)local_74,1,0x16e);
      if (iVar8 == 0) {
        return (char *)0x0;
      }
      local_68->tm_yday = (int)local_74 + -1;
      goto LAB_00105f48;
    case 0x6b:
      if (!(bool)(bVar6 & bVar5)) {
        return (char *)0x0;
      }
LAB_0010643f:
      iVar8 = 0x17;
      goto LAB_00106453;
    case 0x6c:
      if (!(bool)(bVar6 & bVar5)) {
        return (char *)0x0;
      }
LAB_0010620a:
      iVar8 = conv_num((char **)&local_70,&local_50->tm_sec,1,0xc);
      if (iVar8 == 0) {
        return (char *)0x0;
      }
      if (ptVar14->tm_sec == 0xc) {
        ptVar14->tm_sec = 0;
      }
      goto LAB_00105f48;
    case 0x6d:
      if (!bVar5) {
        return (char *)0x0;
      }
      iVar8 = conv_num((char **)&local_70,(int *)local_74,1,0xc);
      if (iVar8 == 0) {
        return (char *)0x0;
      }
      local_68->tm_mon = (int)local_74 + -1;
      goto LAB_00105f48;
    case 0x6e:
    case 0x74:
      if (!bVar6) {
        return (char *)0x0;
      }
      local_70 = local_70 + -1;
      do {
        pbVar1 = local_70 + 1;
        local_70 = local_70 + 1;
      } while ((*(byte *)((long)puVar3 + (long)(char)*pbVar1 * 2 + 1) & 0x20) != 0);
      goto LAB_00105f48;
    case 0x70:
      if (!bVar6) {
        return (char *)0x0;
      }
      pp_Var11 = __ctype_tolower_loc();
      p_Var4 = *pp_Var11;
      lVar12 = 0;
      goto LAB_0010634e;
    case 0x72:
      if (!bVar6) {
        return (char *)0x0;
      }
      pcVar13 = "%I:%M:%S %p";
      break;
    case 0x77:
      if (!bVar5) {
        return (char *)0x0;
      }
      iVar8 = 6;
      ptVar14 = local_48;
LAB_00106453:
      iVar8 = conv_num((char **)&local_70,&ptVar14->tm_sec,0,iVar8);
      if (iVar8 == 0) {
        return (char *)0x0;
      }
      goto LAB_00105f48;
    case 0x78:
      if (!bVar7) {
        return (char *)0x0;
      }
LAB_0010642d:
      pcVar13 = "%m/%d/%y";
      break;
    case 0x79:
      iVar8 = conv_num((char **)&local_70,(int *)local_74,0,99);
      if (iVar8 == 0) {
        return (char *)0x0;
      }
      if (local_5c == 0) {
        auVar9 = local_74;
        if ((int)local_74 < 0x45) {
          auVar9 = (undefined1  [4])((int)local_74 + 100);
        }
        local_68->tm_year = (int)auVar9;
        local_5c = 1;
      }
      else {
        local_68->tm_year = (local_68->tm_year / 100) * 100 + (int)local_74;
LAB_00106532:
        local_5c = 1;
      }
      goto LAB_00105f48;
    }
    local_70 = (byte *)arg_strptime((char *)local_70,pcVar13,local_68);
    if (local_70 == (byte *)0x0) {
      return (char *)0x0;
    }
    goto LAB_00105f48;
  }
  pbVar16 = (byte *)fmt + 1;
switchD_00105f08_caseD_25:
  bVar2 = *local_70;
  local_70 = local_70 + 1;
  if (bVar15 != bVar2) {
    return (char *)0x0;
  }
  goto LAB_00105f48;
LAB_0010634e:
  if (p_Var4[(byte)"AM"[lVar12]] == p_Var4[pbVar1[lVar12]]) goto code_r0x0010636a;
  lVar12 = 0;
  do {
    if (p_Var4[(byte)"PM"[lVar12]] != p_Var4[pbVar1[lVar12]]) {
      return (char *)0x0;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  if (0xb < local_50->tm_sec) {
    return (char *)0x0;
  }
  local_50->tm_sec = local_50->tm_sec + 0xc;
  local_70 = pbVar1 + 2;
  goto LAB_00105f48;
code_r0x0010636a:
  lVar12 = lVar12 + 1;
  if (lVar12 == 3) goto code_r0x00106373;
  goto LAB_0010634e;
code_r0x00106373:
  if (0xb < local_50->tm_sec) {
    return (char *)0x0;
  }
  local_70 = pbVar1 + 2;
  goto LAB_00105f48;
LAB_00105f6d:
  pcVar13 = *(char **)((long)mon + lVar12);
  n = strlen(pcVar13);
  iVar8 = arg_strncasecmp(pcVar13,(char *)pbVar1,n);
  if (iVar8 == 0) goto LAB_001060d1;
  pcVar13 = *(char **)((long)abmon + lVar12);
  n = strlen(pcVar13);
  iVar8 = arg_strncasecmp(pcVar13,(char *)pbVar1,n);
  if (iVar8 == 0) goto LAB_001060d1;
  lVar17 = lVar17 + 1;
  lVar12 = lVar12 + 8;
  if (lVar17 == 0xc) {
    return (char *)0x0;
  }
  goto LAB_00105f6d;
LAB_001060d1:
  local_74 = SUB84(lVar17,0);
  local_68->tm_mon = (int)local_74;
  goto LAB_00106106;
LAB_0010606c:
  pcVar13 = *(char **)((long)day + lVar12);
  n = strlen(pcVar13);
  iVar8 = arg_strncasecmp(pcVar13,(char *)pbVar1,n);
  if (iVar8 == 0) goto LAB_001060ed;
  pcVar13 = *(char **)((long)abday + lVar12);
  n = strlen(pcVar13);
  iVar8 = arg_strncasecmp(pcVar13,(char *)pbVar1,n);
  if (iVar8 == 0) goto LAB_001060ed;
  lVar17 = lVar17 + 1;
  lVar12 = lVar12 + 8;
  if (lVar17 == 7) {
    return (char *)0x0;
  }
  goto LAB_0010606c;
LAB_001060ed:
  local_74 = SUB84(lVar17,0);
  local_48->tm_sec = (int)local_74;
LAB_00106106:
  local_70 = pbVar1 + n;
  ppuVar10 = local_58;
LAB_00105f48:
  bVar15 = *pbVar16;
  fmt = (char *)pbVar16;
  if (bVar15 == 0) {
    return (char *)local_70;
  }
  goto LAB_00105e97;
}

Assistant:

char* arg_strptime(const char* buf, const char* fmt, struct tm* tm) {
    char c;
    const char* bp;
    size_t len = 0;
    int alt_format, i, split_year = 0;

    bp = buf;

    while ((c = *fmt) != '\0') {
        /* Clear `alternate' modifier prior to new conversion. */
        alt_format = 0;

        /* Eat up white-space. */
        if (isspace(c)) {
            while (isspace((int)(*bp)))
                bp++;

            fmt++;
            continue;
        }

        if ((c = *fmt++) != '%')
            goto literal;

    again:
        switch (c = *fmt++) {
            case '%': /* "%%" is converted to "%". */
            literal:
                if (c != *bp++)
                    return (0);
                break;

            /*
             * "Alternative" modifiers. Just set the appropriate flag
             * and start over again.
             */
            case 'E': /* "%E?" alternative conversion modifier. */
                LEGAL_ALT(0);
                alt_format |= ALT_E;
                goto again;

            case 'O': /* "%O?" alternative conversion modifier. */
                LEGAL_ALT(0);
                alt_format |= ALT_O;
                goto again;

            /*
             * "Complex" conversion rules, implemented through recursion.
             */
            case 'c': /* Date and time, using the locale's format. */
                LEGAL_ALT(ALT_E);
                bp = arg_strptime(bp, "%x %X", tm);
                if (!bp)
                    return (0);
                break;

            case 'D': /* The date as "%m/%d/%y". */
                LEGAL_ALT(0);
                bp = arg_strptime(bp, "%m/%d/%y", tm);
                if (!bp)
                    return (0);
                break;

            case 'R': /* The time as "%H:%M". */
                LEGAL_ALT(0);
                bp = arg_strptime(bp, "%H:%M", tm);
                if (!bp)
                    return (0);
                break;

            case 'r': /* The time in 12-hour clock representation. */
                LEGAL_ALT(0);
                bp = arg_strptime(bp, "%I:%M:%S %p", tm);
                if (!bp)
                    return (0);
                break;

            case 'T': /* The time as "%H:%M:%S". */
                LEGAL_ALT(0);
                bp = arg_strptime(bp, "%H:%M:%S", tm);
                if (!bp)
                    return (0);
                break;

            case 'X': /* The time, using the locale's format. */
                LEGAL_ALT(ALT_E);
                bp = arg_strptime(bp, "%H:%M:%S", tm);
                if (!bp)
                    return (0);
                break;

            case 'x': /* The date, using the locale's format. */
                LEGAL_ALT(ALT_E);
                bp = arg_strptime(bp, "%m/%d/%y", tm);
                if (!bp)
                    return (0);
                break;

            /*
             * "Elementary" conversion rules.
             */
            case 'A': /* The day of week, using the locale's form. */
            case 'a':
                LEGAL_ALT(0);
                for (i = 0; i < 7; i++) {
                    /* Full name. */
                    len = strlen(day[i]);
                    if (arg_strncasecmp(day[i], bp, len) == 0)
                        break;

                    /* Abbreviated name. */
                    len = strlen(abday[i]);
                    if (arg_strncasecmp(abday[i], bp, len) == 0)
                        break;
                }

                /* Nothing matched. */
                if (i == 7)
                    return (0);

                tm->tm_wday = i;
                bp += len;
                break;

            case 'B': /* The month, using the locale's form. */
            case 'b':
            case 'h':
                LEGAL_ALT(0);
                for (i = 0; i < 12; i++) {
                    /* Full name. */
                    len = strlen(mon[i]);
                    if (arg_strncasecmp(mon[i], bp, len) == 0)
                        break;

                    /* Abbreviated name. */
                    len = strlen(abmon[i]);
                    if (arg_strncasecmp(abmon[i], bp, len) == 0)
                        break;
                }

                /* Nothing matched. */
                if (i == 12)
                    return (0);

                tm->tm_mon = i;
                bp += len;
                break;

            case 'C': /* The century number. */
                LEGAL_ALT(ALT_E);
                if (!(conv_num(&bp, &i, 0, 99)))
                    return (0);

                if (split_year) {
                    tm->tm_year = (tm->tm_year % 100) + (i * 100);
                } else {
                    tm->tm_year = i * 100;
                    split_year = 1;
                }
                break;

            case 'd': /* The day of month. */
            case 'e':
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_mday, 1, 31)))
                    return (0);
                break;

            case 'k': /* The hour (24-hour clock representation). */
                LEGAL_ALT(0);
            /* FALLTHROUGH */
            case 'H':
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_hour, 0, 23)))
                    return (0);
                break;

            case 'l': /* The hour (12-hour clock representation). */
                LEGAL_ALT(0);
            /* FALLTHROUGH */
            case 'I':
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_hour, 1, 12)))
                    return (0);
                if (tm->tm_hour == 12)
                    tm->tm_hour = 0;
                break;

            case 'j': /* The day of year. */
                LEGAL_ALT(0);
                if (!(conv_num(&bp, &i, 1, 366)))
                    return (0);
                tm->tm_yday = i - 1;
                break;

            case 'M': /* The minute. */
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_min, 0, 59)))
                    return (0);
                break;

            case 'm': /* The month. */
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &i, 1, 12)))
                    return (0);
                tm->tm_mon = i - 1;
                break;

            case 'p': /* The locale's equivalent of AM/PM. */
                LEGAL_ALT(0);
                /* AM? */
                if (arg_strcasecmp(am_pm[0], bp) == 0) {
                    if (tm->tm_hour > 11)
                        return (0);

                    bp += strlen(am_pm[0]);
                    break;
                }
                /* PM? */
                else if (arg_strcasecmp(am_pm[1], bp) == 0) {
                    if (tm->tm_hour > 11)
                        return (0);

                    tm->tm_hour += 12;
                    bp += strlen(am_pm[1]);
                    break;
                }

                /* Nothing matched. */
                return (0);

            case 'S': /* The seconds. */
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_sec, 0, 61)))
                    return (0);
                break;

            case 'U': /* The week of year, beginning on sunday. */
            case 'W': /* The week of year, beginning on monday. */
                LEGAL_ALT(ALT_O);
                /*
                 * XXX This is bogus, as we can not assume any valid
                 * information present in the tm structure at this
                 * point to calculate a real value, so just check the
                 * range for now.
                 */
                if (!(conv_num(&bp, &i, 0, 53)))
                    return (0);
                break;

            case 'w': /* The day of week, beginning on sunday. */
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_wday, 0, 6)))
                    return (0);
                break;

            case 'Y': /* The year. */
                LEGAL_ALT(ALT_E);
                if (!(conv_num(&bp, &i, 0, 9999)))
                    return (0);

                tm->tm_year = i - TM_YEAR_BASE;
                break;

            case 'y': /* The year within 100 years of the epoch. */
                LEGAL_ALT(ALT_E | ALT_O);
                if (!(conv_num(&bp, &i, 0, 99)))
                    return (0);

                if (split_year) {
                    tm->tm_year = ((tm->tm_year / 100) * 100) + i;
                    break;
                }
                split_year = 1;
                if (i <= 68)
                    tm->tm_year = i + 2000 - TM_YEAR_BASE;
                else
                    tm->tm_year = i + 1900 - TM_YEAR_BASE;
                break;

            /*
             * Miscellaneous conversions.
             */
            case 'n': /* Any kind of white-space. */
            case 't':
                LEGAL_ALT(0);
                while (isspace((int)(*bp)))
                    bp++;
                break;

            default: /* Unknown/unsupported conversion. */
                return (0);
        }
    }

    /* LINTED functional specification */
    return ((char*)bp);
}